

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

uint32_t helper_neon_qrdmlah_s16_aarch64
                   (CPUARMState_conflict *env,uint32_t src1,uint32_t src2,uint32_t src3)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = (int)(short)src2 * (int)(short)src1 + (short)src3 * 0x8000 + 0x4000;
  uVar3 = iVar2 >> 0xf;
  if ((int)(short)uVar3 != uVar3) {
    (env->vfp).qc[0] = 1;
    uVar3 = iVar2 >> 0x1f ^ 0x7fff;
  }
  iVar2 = ((int)src2 >> 0x10) * ((int)src1 >> 0x10) + ((int)src3 >> 1 & 0xffff8000U) + 0x4000;
  uVar1 = iVar2 >> 0xf;
  if ((int)(short)uVar1 != uVar1) {
    (env->vfp).qc[0] = 1;
    uVar1 = iVar2 >> 0x1f ^ 0x7fff;
  }
  return uVar1 << 0x10 | uVar3 & 0xffff;
}

Assistant:

static uint16_t inl_qrdmlah_s16(CPUARMState *env, int16_t src1,
                                int16_t src2, int16_t src3)
{
    /* Simplify:
     * = ((a3 << 16) + ((e1 * e2) << 1) + (1 << 15)) >> 16
     * = ((a3 << 15) + (e1 * e2) + (1 << 14)) >> 15
     */
    int32_t ret = (int32_t)src1 * src2;
    ret = ((int32_t)src3 << 15) + ret + (1 << 14);
    ret >>= 15;
    if (ret != (int16_t)ret) {
        SET_QC();
        ret = (ret < 0 ? -0x8000 : 0x7fff);
    }
    return ret;
}